

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::closure(Automaton *this,StatePointer state)

{
  State *this_00;
  ItemPointer item;
  bool bVar1;
  iterator iVar2;
  _Bucket *this_01;
  const_iterator cVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  const_iterator it;
  long in_FS_OFFSET;
  pair<QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator,_QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator>
  pVar7;
  pair<std::_List_iterator<Item>,_bool> pVar8;
  pair<std::_List_iterator<State>,_bool> pVar9;
  State local_c8;
  QArrayDataPointer<std::_List_iterator<Item>_> local_78;
  QMap<std::_List_iterator<QString>,__Bucket> local_60;
  undefined1 local_58 [8];
  _List_iterator<State> *p_Stack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (state._M_node[2]._M_prev == (_List_node_base *)&state._M_node[2]._M_prev) {
    local_60.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,__Bucket,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,__Bucket>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,__Bucket,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,__Bucket>_>_>_>_*>
            )0x0;
    this_00 = (State *)(state._M_node + 1);
    local_78.d = (Data *)0x0;
    local_78.ptr = (_List_iterator<Item> *)0x0;
    local_78.size = 0;
    local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)this_00;
    while (local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
           super__List_node_base._M_next =
                (((State *)
                 local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
                 super__List_node_base._M_next)->kernel).
                super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.super__List_node_base.
                _M_next,
          (State *)local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
                   super__List_node_base._M_next != this_00) {
      QList<std::_List_iterator<Item>>::emplaceBack<std::_List_iterator<Item>const&>
                ((QList<std::_List_iterator<Item>> *)&local_78,(_List_iterator<Item> *)&local_c8);
    }
    std::__cxx11::list<Item,_std::allocator<Item>_>::operator=
              ((list<Item,_std::allocator<Item>_> *)&state._M_node[2]._M_prev,
               (list<Item,_std::allocator<Item>_> *)this_00);
    while (local_78.size != 0) {
      iVar2 = QList<std::_List_iterator<Item>_>::end((QList<std::_List_iterator<Item>_> *)&local_78)
      ;
      item._M_node = iVar2.i[-1]._M_node;
      QList<std::_List_iterator<Item>_>::takeLast((QList<std::_List_iterator<Item>_> *)&local_78);
      if (item._M_node[1]._M_prev != (_List_node_base *)&item._M_node[1]._M_next[1]._M_prev) {
        this_01 = QMap<std::_List_iterator<QString>,__Bucket>::operator[]
                            (&local_60,(_List_iterator<QString> *)(item._M_node[1]._M_prev + 1));
        _Bucket::insert(this_01,item);
        bVar1 = Grammar::isNonTerminal(this->_M_grammar,item._M_node[1]._M_prev[1]._M_next);
        if (bVar1) {
          pVar7 = QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::equal_range
                            (&this->_M_grammar->rule_map,
                             (_List_iterator<QString> *)(item._M_node[1]._M_prev + 1));
          for (cVar3._M_node = (_Base_ptr)pVar7.first.i._M_node;
              (const_iterator)cVar3._M_node != pVar7.second.i._M_node.i;
              cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node)) {
            local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
            super__List_node_base._M_next = (_List_node_base *)cVar3._M_node[1]._M_parent;
            local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
            super__List_node_base._M_prev =
                 (((State *)
                  local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
                  super__List_node_base._M_next)->closure).
                 super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.super__List_node_base
                 ._M_next;
            local_58 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
            p_Stack_50 = (_List_iterator<State> *)0xaaaaaaaaaaaaaaaa;
            pVar8 = State::insertClosure(this_00,(Item *)&local_c8);
            local_58 = (undefined1  [8])pVar8.first._M_node;
            p_Stack_50 = (_List_iterator<State> *)CONCAT71(p_Stack_50._1_7_,pVar8.second);
            if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              QList<std::_List_iterator<Item>>::emplaceBack<std::_List_iterator<Item>const&>
                        ((QList<std::_List_iterator<Item>> *)&local_78,
                         (_List_iterator<Item> *)local_58);
            }
          }
        }
      }
    }
    local_58 = (undefined1  [8])0x0;
    p_Stack_50 = (_List_iterator<State> *)0x0;
    local_48 = 0;
    iVar4._M_node = (_Base_ptr)QMap<std::_List_iterator<QString>,__Bucket>::begin(&local_60);
    while( true ) {
      iVar5 = QMap<std::_List_iterator<QString>,__Bucket>::end(&local_60);
      if ((iterator)iVar4._M_node == iVar5.i._M_node) break;
      _Bucket::toState(&local_c8,(_Bucket *)&iVar4._M_node[1]._M_parent,this);
      pVar9 = internState(this,&local_c8);
      State::~State(&local_c8);
      local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
      super__List_node_base._M_next = pVar9.first._M_node._M_node;
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        QList<std::_List_iterator<State>>::emplaceBack<std::_List_iterator<State>const&>
                  ((QList<std::_List_iterator<State>> *)local_58,(_List_iterator<State> *)&local_c8)
        ;
      }
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::insert
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                 (state._M_node + 4),(_List_iterator<QString> *)(iVar4._M_node + 1),
                 (_List_iterator<State> *)&local_c8);
      iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node);
    }
    while (local_48 != 0) {
      iVar6 = QList<std::_List_iterator<State>_>::begin
                        ((QList<std::_List_iterator<State>_> *)local_58);
      closure(this,(iVar6.i)->_M_node);
      QList<std::_List_iterator<State>_>::removeFirst
                ((QList<std::_List_iterator<State>_> *)local_58);
    }
    QArrayDataPointer<std::_List_iterator<State>_>::~QArrayDataPointer
              ((QArrayDataPointer<std::_List_iterator<State>_> *)local_58);
    QArrayDataPointer<std::_List_iterator<Item>_>::~QArrayDataPointer(&local_78);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,__Bucket,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,__Bucket>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_60.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::closure (StatePointer state)
{
  if (! state->closure.empty ()) // ### not true.
    return;

  typedef QMap<Name, _Bucket> bucket_map_type;

  bucket_map_type buckets;
  QStack<ItemPointer> working_list;

  for (ItemPointer item = state->kernel.begin (); item != state->kernel.end (); ++item)
    working_list.push (item);

  state->closure = state->kernel;

  while (! working_list.empty ())
    {
      ItemPointer item = working_list.top ();
      working_list.pop ();

      if (item->isReduceItem ())
        continue;

      buckets [*item->dot].insert (item);

      if (_M_grammar->isNonTerminal (*item->dot))
        {
          const auto range = std::as_const(_M_grammar->rule_map).equal_range(*item->dot);
          for (auto it = range.first; it != range.second; ++it)
            {
              const RulePointer &rule = *it;
              Item ii;
              ii.rule = rule;
              ii.dot = rule->rhs.begin ();

              std::pair<ItemPointer, bool> r = state->insertClosure(ii);

              if (r.second)
                working_list.push (r.first);
            }
        }
    }

  QList<StatePointer> todo;

  for (bucket_map_type::iterator bucket = buckets.begin (); bucket != buckets.end (); ++bucket)
    {
      std::pair<StatePointer, bool> r = internState(bucket->toState(this));

      StatePointer target = r.first;

      if (r.second)
        todo.push_back (target);

      state->bundle.insert (bucket.key(), target);
    }

  while (! todo.empty ())
    {
      closure (todo.front ());
      todo.pop_front ();
    }
}